

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool tinyxml2::XMLUtil::ToUnsigned64(char *str,uint64_t *value)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  unsigned_long_long v;
  uint64_t local_20;
  
  local_20 = 0;
  bVar1 = *str;
  pcVar4 = str;
  while ((-1 < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
    bVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  }
  if (*pcVar4 == '0') {
    pcVar3 = "%llu";
    if ((pcVar4[1] & 0xdfU) == 0x58) {
      pcVar3 = "%llx";
    }
  }
  else {
    pcVar3 = "%llu";
  }
  iVar2 = __isoc99_sscanf(str,pcVar3,&local_20);
  if (iVar2 == 1) {
    *value = local_20;
  }
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned64(const char* str, uint64_t* value) {
    unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llu
    if(TIXML_SSCANF(str, IsPrefixHex(str) ? "%llx" : "%llu", &v) == 1) {
        *value = (uint64_t)v;
        return true;
    }
    return false;
}